

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

ID __thiscall Fl_Plugin_Manager::addPlugin(Fl_Plugin_Manager *this,char *name,Fl_Plugin *plugin)

{
  ID pvVar1;
  undefined1 local_60 [8];
  Fl_Preferences pin;
  char buf [34];
  Fl_Plugin *plugin_local;
  char *name_local;
  Fl_Plugin_Manager *this_local;
  
  Fl_Preferences::Fl_Preferences((Fl_Preferences *)local_60,&this->super_Fl_Preferences,name);
  pin.rootNode._0_1_ = 0x40;
  p2a(plugin,(char *)((long)&pin.rootNode + 1));
  Fl_Preferences::set((Fl_Preferences *)local_60,"address",(char *)&pin.rootNode);
  pvVar1 = Fl_Preferences::id((Fl_Preferences *)local_60);
  Fl_Preferences::~Fl_Preferences((Fl_Preferences *)local_60);
  return pvVar1;
}

Assistant:

Fl_Preferences::ID Fl_Plugin_Manager::addPlugin(const char *name, Fl_Plugin *plugin) {
  char buf[34];
#ifdef FL_PLUGIN_VERBOSE
  printf("Fl_Plugin: adding plugin named \"%s\" at 0x%p\n", name, plugin);
#endif
  Fl_Preferences pin(this, name);
  buf[0] = '@'; p2a(plugin, buf+1);
  pin.set("address", buf);
  return pin.id();
}